

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelServiceDescriptorName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,ServiceDescriptor *descriptor)

{
  string *psVar1;
  FileDescriptor *pFVar2;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_21;
  ServiceDescriptor *local_20;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = descriptor;
  descriptor_local = (ServiceDescriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  psVar1 = ServiceDescriptor::name_abi_cxx11_(descriptor);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  UpperString(__return_storage_ptr__);
  std::operator+(&local_58,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pFVar2 = ServiceDescriptor::file(local_20);
  if (pFVar2 != this->file_) {
    pFVar2 = ServiceDescriptor::file(local_20);
    psVar1 = FileDescriptor::name_abi_cxx11_(pFVar2);
    anon_unknown_0::ModuleAlias(&local_b8,psVar1);
    std::operator+(&local_98,&local_b8,".");
    std::operator+(&local_78,&local_98,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::ModuleLevelServiceDescriptorName(
    const ServiceDescriptor& descriptor) const {
  string name = descriptor.name();
  UpperString(&name);
  name = "_" + name;
  if (descriptor.file() != file_) {
    name = ModuleAlias(descriptor.file()->name()) + "." + name;
  }
  return name;
}